

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

Vec_Ptr_t * Bac_ManCollectGateNamesByTruth(Mio_Library_t *pLib)

{
  Vec_Ptr_t *vGateNames_00;
  Vec_Ptr_t *vGateNames;
  Mio_Library_t *pLib_local;
  
  vGateNames_00 = Vec_PtrStart(0xb);
  Bac_ManCollectGateNameOne(pLib,PTR_GATE_C0,0,vGateNames_00);
  Bac_ManCollectGateNameOne(pLib,PTR_GATE_C1,0xffffffffffffffff,vGateNames_00);
  Bac_ManCollectGateNameOne
            (pLib,PTR_GATE_BUF,Bac_ManCollectGateNamesByTruth::uTruths6[0],vGateNames_00);
  Bac_ManCollectGateNameOne
            (pLib,PTR_GATE_INV,Bac_ManCollectGateNamesByTruth::uTruths6[0] ^ 0xffffffffffffffff,
             vGateNames_00);
  Bac_ManCollectGateNameOne
            (pLib,PTR_GATE_AND,
             Bac_ManCollectGateNamesByTruth::uTruths6[0] &
             Bac_ManCollectGateNamesByTruth::uTruths6[1],vGateNames_00);
  Bac_ManCollectGateNameOne
            (pLib,PTR_GATE_NAND,
             Bac_ManCollectGateNamesByTruth::uTruths6[0] &
             Bac_ManCollectGateNamesByTruth::uTruths6[1] ^ 0xffffffffffffffff,vGateNames_00);
  Bac_ManCollectGateNameOne
            (pLib,PTR_GATE_OR,
             Bac_ManCollectGateNamesByTruth::uTruths6[0] |
             Bac_ManCollectGateNamesByTruth::uTruths6[1],vGateNames_00);
  Bac_ManCollectGateNameOne
            (pLib,PTR_GATE_NOR,
             (Bac_ManCollectGateNamesByTruth::uTruths6[0] |
             Bac_ManCollectGateNamesByTruth::uTruths6[1]) ^ 0xffffffffffffffff,vGateNames_00);
  Bac_ManCollectGateNameOne
            (pLib,PTR_GATE_XOR,
             Bac_ManCollectGateNamesByTruth::uTruths6[0] ^
             Bac_ManCollectGateNamesByTruth::uTruths6[1],vGateNames_00);
  Bac_ManCollectGateNameOne
            (pLib,PTR_GATE_XNOR,
             Bac_ManCollectGateNamesByTruth::uTruths6[0] ^
             Bac_ManCollectGateNamesByTruth::uTruths6[1] ^ 0xffffffffffffffff,vGateNames_00);
  return vGateNames_00;
}

Assistant:

Vec_Ptr_t * Bac_ManCollectGateNamesByTruth( Mio_Library_t * pLib )
{
    static word uTruths6[3] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
    };
    Vec_Ptr_t * vGateNames = Vec_PtrStart( PTR_GATE_UNKNOWN );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_C0,              0,                 vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_C1,       ~(word)0,                 vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_BUF,    uTruths6[0],                vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_INV,   ~uTruths6[0],                vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_AND,   (uTruths6[0] & uTruths6[1]), vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_NAND, ~(uTruths6[0] & uTruths6[1]), vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_OR,    (uTruths6[0] | uTruths6[1]), vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_NOR,  ~(uTruths6[0] | uTruths6[1]), vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_XOR,   (uTruths6[0] ^ uTruths6[1]), vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_XNOR, ~(uTruths6[0] ^ uTruths6[1]), vGateNames );
    return vGateNames;
}